

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O1

void __thiscall Fl_Shared_Image::Fl_Shared_Image(Fl_Shared_Image *this,char *n,Fl_Image *img)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  
  Fl_Image::Fl_Image(&this->super_Fl_Image,0,0,0);
  (this->super_Fl_Image)._vptr_Fl_Image = (_func_int **)&PTR__Fl_Shared_Image_00279130;
  sVar2 = strlen(n);
  __dest = (char *)operator_new__(sVar2 + 1);
  this->name_ = __dest;
  strcpy(__dest,n);
  this->image_ = img;
  this->alloc_image_ = (uint)(img == (Fl_Image *)0x0);
  this->original_ = 1;
  this->refcount_ = 1;
  if (img == (Fl_Image *)0x0) {
    reload(this);
  }
  else {
    (this->super_Fl_Image).w_ = img->w_;
    (this->super_Fl_Image).h_ = img->h_;
    (this->super_Fl_Image).d_ = img->d_;
    iVar1 = img->count_;
    (this->super_Fl_Image).data_ = img->data_;
    (this->super_Fl_Image).count_ = iVar1;
  }
  return;
}

Assistant:

Fl_Shared_Image::Fl_Shared_Image(const char *n,		// I - Filename
                                 Fl_Image   *img)	// I - Image
  : Fl_Image(0,0,0) {
  name_ = new char[strlen(n) + 1];
  strcpy((char *)name_, n);

  refcount_    = 1;
  image_       = img;
  alloc_image_ = !img;
  original_    = 1;
#if FLTK_ABI_VERSION >= 10304
  scaled_image_= 0;
#endif

  if (!img) reload();
  else update();
}